

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

vec4 vec4_apply_mat(vec4 v,mat4 m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vec4 vVar5;
  
  fVar1 = v.x;
  fVar2 = v.y;
  fVar3 = v.z;
  fVar4 = v.w;
  vVar5.x = fVar1 * m.m[0] + m.m[1] * fVar2 + fVar3 * m.m[2] + m.m[3] * fVar4;
  vVar5.y = fVar1 * m.m[4] + m.m[5] * fVar2 + fVar3 * m.m[6] + m.m[7] * fVar4;
  vVar5.w = fVar1 * m.m[0xc] + m.m[0xd] * fVar2 + fVar3 * m.m[0xe] + m.m[0xf] * fVar4;
  vVar5.z = fVar1 * m.m[8] + m.m[9] * fVar2 + fVar3 * m.m[10] + m.m[0xb] * fVar4;
  return vVar5;
}

Assistant:

vec4 vec4_apply_mat(vec4 v, mat4 m) {
    float x = m.m[0] * v.x + m.m[1] * v.y + m.m[2] * v.z + m.m[3] * v.w;
    float y = m.m[4] * v.x + m.m[5] * v.y + m.m[6] * v.z + m.m[7] * v.w;
    float z = m.m[8] * v.x + m.m[9] * v.y + m.m[10] * v.z + m.m[11] * v.w;
    float w = m.m[12] * v.x + m.m[13] * v.y + m.m[14] * v.z + m.m[15] * v.w;
    return vec4_create(x, y, z, w);
}